

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall
re2::Regexp::ParseState::ParseCharClass
          (ParseState *this,StringPiece *s,Regexp **out_re,RegexpStatus *status)

{
  Rune lo;
  Rune hi;
  bool bVar1;
  bool bVar2;
  ParseFlags b;
  ParseFlags PVar3;
  ParseStatus PVar4;
  const_reference pcVar5;
  Regexp *this_00;
  CharClassBuilder *pCVar6;
  size_type sVar7;
  const_pointer str;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  byte bVar8;
  RuneRange local_a8;
  RuneRange rr;
  UGroup *g;
  int local_88;
  Rune local_84;
  int n;
  Rune r;
  StringPiece t;
  bool first;
  Regexp *re;
  undefined1 local_50 [7];
  bool negated;
  undefined1 local_40 [8];
  StringPiece whole_class;
  RegexpStatus *status_local;
  Regexp **out_re_local;
  StringPiece *s_local;
  ParseState *this_local;
  
  local_40 = (undefined1  [8])s->data_;
  whole_class.data_ = (const_pointer)s->size_;
  whole_class.size_ = (size_type)status;
  bVar1 = StringPiece::empty(s);
  if ((bVar1) || (pcVar5 = StringPiece::operator[](s,0), *pcVar5 != '[')) {
    RegexpStatus::set_code((RegexpStatus *)whole_class.size_,kRegexpInternalError);
    sVar7 = whole_class.size_;
    StringPiece::StringPiece((StringPiece *)local_50);
    RegexpStatus::set_error_arg((RegexpStatus *)sVar7,(StringPiece *)local_50);
    return false;
  }
  bVar1 = false;
  this_00 = (Regexp *)
            operator_new(CONCAT17(in_stack_ffffffffffffff27,
                                  CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
  PVar3 = this->flags_;
  b = operator~(FoldCase);
  PVar3 = operator&(PVar3,b);
  Regexp(this_00,kRegexpCharClass,PVar3);
  pCVar6 = (CharClassBuilder *)
           operator_new(CONCAT17(in_stack_ffffffffffffff27,
                                 CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
  CharClassBuilder::CharClassBuilder(pCVar6);
  (this_00->field_7).field_3.ccb_ = pCVar6;
  StringPiece::remove_prefix(s,1);
  bVar2 = StringPiece::empty(s);
  if ((!bVar2) && (pcVar5 = StringPiece::operator[](s,0), *pcVar5 == '^')) {
    StringPiece::remove_prefix(s,1);
    bVar1 = true;
    PVar3 = operator&(this->flags_,ClassNL);
    if ((PVar3 == NoParseFlags) || (PVar3 = operator&(this->flags_,NeverNL), PVar3 != NoParseFlags))
    {
      CharClassBuilder::AddRange((this_00->field_7).field_3.ccb_,10,10);
    }
  }
  t.size_._3_1_ = 1;
LAB_0036a973:
  bVar2 = StringPiece::empty(s);
  bVar8 = 0;
  if (!bVar2) {
    pcVar5 = StringPiece::operator[](s,0);
    bVar8 = 1;
    if (*pcVar5 == ']') {
      bVar8 = t.size_._3_1_;
    }
  }
  if ((bVar8 & 1) == 0) {
    bVar2 = StringPiece::empty(s);
    if (!bVar2) {
      StringPiece::remove_prefix(s,1);
      if (bVar1) {
        CharClassBuilder::Negate((this_00->field_7).field_3.ccb_);
      }
      *out_re = this_00;
      return true;
    }
    RegexpStatus::set_code((RegexpStatus *)whole_class.size_,kRegexpMissingBracket);
    RegexpStatus::set_error_arg((RegexpStatus *)whole_class.size_,(StringPiece *)local_40);
    Decref(this_00);
    return false;
  }
  pcVar5 = StringPiece::operator[](s,0);
  if ((((*pcVar5 == '-') && ((t.size_._3_1_ & 1) == 0)) &&
      (PVar3 = operator&(this->flags_,PerlX), PVar3 == NoParseFlags)) &&
     ((sVar7 = StringPiece::size(s), sVar7 == 1 ||
      (pcVar5 = StringPiece::operator[](s,1), *pcVar5 != ']')))) {
    _n = s->data_;
    t.data_ = (const_pointer)s->size_;
    StringPiece::remove_prefix((StringPiece *)&n,1);
    local_88 = StringPieceToRune(&local_84,(StringPiece *)&n,(RegexpStatus *)whole_class.size_);
    if (local_88 < 0) {
      Decref(this_00);
      return false;
    }
    RegexpStatus::set_code((RegexpStatus *)whole_class.size_,kRegexpBadCharRange);
    sVar7 = whole_class.size_;
    str = StringPiece::data(s);
    StringPiece::StringPiece((StringPiece *)&g,str,(long)(local_88 + 1));
    RegexpStatus::set_error_arg((RegexpStatus *)sVar7,(StringPiece *)&g);
    Decref(this_00);
    return false;
  }
  t.size_._3_1_ = 0;
  sVar7 = StringPiece::size(s);
  if ((2 < sVar7) &&
     ((pcVar5 = StringPiece::operator[](s,0), *pcVar5 == '[' &&
      (pcVar5 = StringPiece::operator[](s,1), *pcVar5 == ':')))) goto code_r0x0036ab22;
  goto LAB_0036ab83;
code_r0x0036ab22:
  PVar4 = ParseCCName(s,this->flags_,(this_00->field_7).field_3.ccb_,
                      (RegexpStatus *)whole_class.size_);
  if (PVar4 != kParseOk) {
    if (PVar4 == kParseError) {
      Decref(this_00);
      return false;
    }
LAB_0036ab83:
    sVar7 = StringPiece::size(s);
    if (((2 < sVar7) && (pcVar5 = StringPiece::operator[](s,0), *pcVar5 == '\\')) &&
       ((pcVar5 = StringPiece::operator[](s,1), *pcVar5 == 'p' ||
        (pcVar5 = StringPiece::operator[](s,1), *pcVar5 == 'P')))) {
      PVar4 = ParseUnicodeGroup(s,this->flags_,(this_00->field_7).field_3.ccb_,
                                (RegexpStatus *)whole_class.size_);
      if (PVar4 == kParseOk) goto LAB_0036a973;
      if (PVar4 == kParseError) {
        Decref(this_00);
        return false;
      }
    }
    rr = (RuneRange)MaybeParsePerlCCEscape(s,this->flags_);
    if (rr == (RuneRange)0x0) {
      RuneRange::RuneRange(&local_a8);
      bVar2 = ParseCCRange(this,s,&local_a8,(StringPiece *)local_40,
                           (RegexpStatus *)whole_class.size_);
      hi = local_a8.hi;
      lo = local_a8.lo;
      if (!bVar2) {
        Decref(this_00);
        return false;
      }
      pCVar6 = (this_00->field_7).field_3.ccb_;
      PVar3 = operator|(this->flags_,ClassNL);
      CharClassBuilder::AddRangeFlags(pCVar6,lo,hi,PVar3);
    }
    else {
      AddUGroup((this_00->field_7).field_3.ccb_,(UGroup *)rr,*(int *)((long)rr + 8),this->flags_);
    }
  }
  goto LAB_0036a973;
}

Assistant:

bool Regexp::ParseState::ParseCharClass(StringPiece* s,
                                        Regexp** out_re,
                                        RegexpStatus* status) {
  StringPiece whole_class = *s;
  if (s->empty() || (*s)[0] != '[') {
    // Caller checked this.
    status->set_code(kRegexpInternalError);
    status->set_error_arg(StringPiece());
    return false;
  }
  bool negated = false;
  Regexp* re = new Regexp(kRegexpCharClass, flags_ & ~FoldCase);
  re->ccb_ = new CharClassBuilder;
  s->remove_prefix(1);  // '['
  if (!s->empty() && (*s)[0] == '^') {
    s->remove_prefix(1);  // '^'
    negated = true;
    if (!(flags_ & ClassNL) || (flags_ & NeverNL)) {
      // If NL can't match implicitly, then pretend
      // negated classes include a leading \n.
      re->ccb_->AddRange('\n', '\n');
    }
  }
  bool first = true;  // ] is okay as first char in class
  while (!s->empty() && ((*s)[0] != ']' || first)) {
    // - is only okay unescaped as first or last in class.
    // Except that Perl allows - anywhere.
    if ((*s)[0] == '-' && !first && !(flags_&PerlX) &&
        (s->size() == 1 || (*s)[1] != ']')) {
      StringPiece t = *s;
      t.remove_prefix(1);  // '-'
      Rune r;
      int n = StringPieceToRune(&r, &t, status);
      if (n < 0) {
        re->Decref();
        return false;
      }
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(StringPiece(s->data(), 1+n));
      re->Decref();
      return false;
    }
    first = false;

    // Look for [:alnum:] etc.
    if (s->size() > 2 && (*s)[0] == '[' && (*s)[1] == ':') {
      switch (ParseCCName(s, flags_, re->ccb_, status)) {
        case kParseOk:
          continue;
        case kParseError:
          re->Decref();
          return false;
        case kParseNothing:
          break;
      }
    }

    // Look for Unicode character group like \p{Han}
    if (s->size() > 2 &&
        (*s)[0] == '\\' &&
        ((*s)[1] == 'p' || (*s)[1] == 'P')) {
      switch (ParseUnicodeGroup(s, flags_, re->ccb_, status)) {
        case kParseOk:
          continue;
        case kParseError:
          re->Decref();
          return false;
        case kParseNothing:
          break;
      }
    }

    // Look for Perl character class symbols (extension).
    const UGroup *g = MaybeParsePerlCCEscape(s, flags_);
    if (g != NULL) {
      AddUGroup(re->ccb_, g, g->sign, flags_);
      continue;
    }

    // Otherwise assume single character or simple range.
    RuneRange rr;
    if (!ParseCCRange(s, &rr, whole_class, status)) {
      re->Decref();
      return false;
    }
    // AddRangeFlags is usually called in response to a class like
    // \p{Foo} or [[:foo:]]; for those, it filters \n out unless
    // Regexp::ClassNL is set.  In an explicit range or singleton
    // like we just parsed, we do not filter \n out, so set ClassNL
    // in the flags.
    re->ccb_->AddRangeFlags(rr.lo, rr.hi, flags_ | Regexp::ClassNL);
  }
  if (s->empty()) {
    status->set_code(kRegexpMissingBracket);
    status->set_error_arg(whole_class);
    re->Decref();
    return false;
  }
  s->remove_prefix(1);  // ']'

  if (negated)
    re->ccb_->Negate();

  *out_re = re;
  return true;
}